

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize_expr.cpp
# Opt level: O1

bool anon_unknown.dwarf_4c26::test_optim_equiv_random
               (string *str,uint32_t var_id,double xmin,double xmax)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  string err;
  Expr expr;
  Expr orig;
  string local_98;
  double local_78;
  double local_70;
  double local_68;
  Expr local_60;
  Expr local_48;
  
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  local_78 = xmax;
  local_70 = xmin;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"a","");
  nivalis::Environment::set((Environment *)&(anonymous_namespace)::env,&local_98,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)paVar1;
  nivalis::parse(&local_60,str,(Environment *)&(anonymous_namespace)::env,false,true,0,&local_98);
  nivalis::util::trim(&local_98);
  if (local_98._M_string_length == 0) {
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
              (&local_48.ast,&local_60.ast);
    nivalis::Expr::optimize(&local_60,5);
    local_78 = local_78 - local_70;
    iVar5 = 0;
    iVar4 = 1000;
    do {
      dVar7 = std::
              generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                        ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         &nivalis::test::(anonymous_namespace)::reng);
      *(double *)((anonymous_namespace)::env + (ulong)var_id * 8) = dVar7 * local_78 + local_70;
      local_68 = nivalis::Expr::operator()(&local_60,(Environment *)&(anonymous_namespace)::env);
      dVar7 = nivalis::Expr::operator()(&local_48,(Environment *)&(anonymous_namespace)::env);
      if ((!NAN(local_68)) || (uVar2 = 1, !NAN(dVar7))) {
        dVar8 = ABS(local_68 - dVar7);
        dVar7 = ABS((local_68 - dVar7) / local_68);
        if (dVar8 <= dVar7) {
          dVar7 = dVar8;
        }
        uVar2 = (uint)(dVar7 < 1e-06);
      }
      iVar5 = iVar5 + uVar2;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    bVar6 = iVar5 == 1000;
    if (!bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Optimization equiv test fail\nopti ",0x22);
      poVar3 = nivalis::operator<<((ostream *)&std::cerr,&local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\norig ",6);
      poVar3 = nivalis::operator<<(poVar3,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
    if (local_48.ast.
        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Provided expression failed to parse: ",0x25);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    bVar6 = false;
  }
  if (local_60.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool test_optim_equiv_random(const std::string& str,
            uint32_t var_id,
            double xmin = -100, double xmax = 100) {
        env.set("a", 10.);
        std::string err;
        Expr expr = parse(str, env, false, true, 0, &err);
        util::trim(err);
        if (err.size()) {
            std::cout << "Provided expression failed to parse: " << err << "\n";
            return false;
        }
        Expr orig = expr;
        expr.optimize();
        int cnt = 0;
        static const int N_ITER = 1000;
        std::uniform_real_distribution<double> unif(xmin, xmax);
        for (int i = 0; i < N_ITER; ++i) {
            double x = unif(test::reng);
            env.vars[var_id] = x;
            double fx = expr(env);
            double ofx = orig(env);
            if (std::isnan(fx) && std::isnan(ofx)) ++cnt;
            else cnt += (absrelerr(fx, ofx) < FLOAT_EPS);
        }
        if (cnt != N_ITER) {
            std::cerr << "Optimization equiv test fail\nopti " << expr <<
                "\norig " << orig << "\n";
            return false;
        }
        return true;
    }